

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimersRegistry.cpp
# Opt level: O0

void __thiscall TimersRegistry::TraceAll(TimersRegistry *this)

{
  bool bVar1;
  Trace *pTVar2;
  pointer ppVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long miliseconds;
  long seconds;
  long minutes;
  long hours;
  _Self local_18;
  iterator it;
  TimersRegistry *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>_>
       ::begin(&this->mTimers);
  pTVar2 = Trace::DefaultTrace();
  Trace::TraceToLog(pTVar2,"Start Tracing Timers");
  while( true ) {
    hours = (long)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>_>
                  ::end(&this->mTimers);
    bVar1 = std::operator!=(&local_18,(_Self *)&hours);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>
             ::operator->(&local_18);
    dVar5 = Timer::GetTotalMiliSeconds(&ppVar3->second);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>
             ::operator->(&local_18);
    dVar6 = Timer::GetTotalMiliSeconds(&ppVar3->second);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>
             ::operator->(&local_18);
    dVar7 = Timer::GetTotalMiliSeconds(&ppVar3->second);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>
             ::operator->(&local_18);
    dVar8 = Timer::GetTotalMiliSeconds(&ppVar3->second);
    pTVar2 = Trace::DefaultTrace();
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>
    ::operator->(&local_18);
    uVar4 = std::__cxx11::string::c_str();
    Trace::TraceToLog(pTVar2,"Tracing Timer %s. total time [h:m:s:ms] = %ld:%ld:%ld:%ld",uVar4,
                      (long)dVar5 / 3600000,((long)dVar6 % 3600000) / 60000,
                      ((long)dVar7 % 60000) / 1000,(long)dVar8 % 1000);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Timer>_>
    ::operator++(&local_18);
  }
  pTVar2 = Trace::DefaultTrace();
  Trace::TraceToLog(pTVar2,"End Tracing Timers");
  return;
}

Assistant:

void TimersRegistry::TraceAll()
{
	StringToTimerMap::iterator it = mTimers.begin();
	
	TRACE_LOG("Start Tracing Timers");
	for(; it != mTimers.end(); ++it)
	{
		long hours = (long)it->second.GetTotalMiliSeconds()/3600000;
		long minutes = ((long)it->second.GetTotalMiliSeconds()%3600000) / 60000;
		long seconds = ((long)it->second.GetTotalMiliSeconds()%60000) / 1000;
		long miliseconds = (long)it->second.GetTotalMiliSeconds()%1000;
		TRACE_LOG5("Tracing Timer %s. total time [h:m:s:ms] = %ld:%ld:%ld:%ld",
						it->first.c_str(),hours,minutes,seconds,miliseconds);
	}
	TRACE_LOG("End Tracing Timers");
}